

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_api_v2.c
# Opt level: O1

MPP_RET h264e_start(void *ctx,HalEncTask *task)

{
  MppEncRefFrmUsrCfg *pMVar1;
  RK_S32 RVar2;
  uint uVar3;
  MppMeta meta;
  H264eCtx *p;
  RK_S32 force_tid;
  RK_S32 force_use_lt_idx;
  RK_S32 base_layer_pid;
  RK_S32 force_frame_qp;
  RK_S32 force_lt_idx;
  RK_S32 local_54;
  RK_S32 local_50;
  RK_S32 local_4c;
  RK_S32 local_48;
  RK_S32 local_44;
  EncRcTask *local_40;
  void *local_38;
  
  if (((byte)h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","enter\n","h264e_start");
  }
  RVar2 = mpp_frame_has_meta(task->frame);
  if (RVar2 != 0) {
    local_40 = task->rc_task;
    pMVar1 = task->frm_cfg;
    local_38 = ctx;
    meta = mpp_frame_get_meta(task->frame);
    local_44 = -1;
    local_50 = -1;
    local_48 = -1;
    local_4c = -1;
    local_54 = -1;
    mpp_meta_get_s32(meta,KEY_ENC_MARK_LTR,&local_44);
    mpp_meta_get_s32(meta,KEY_ENC_USE_LTR,&local_50);
    mpp_meta_get_s32(meta,KEY_ENC_FRAME_QP,&local_48);
    mpp_meta_get_s32(meta,KEY_ENC_BASE_LAYER_PID,&local_4c);
    mpp_meta_get_s32(meta,KEY_TEMPORAL_ID,&local_54);
    if (-1 < local_44) {
      *(byte *)&pMVar1->force_flag = (byte)pMVar1->force_flag | 4;
      pMVar1->force_lt_idx = local_44;
    }
    if (-1 < local_50) {
      *(byte *)&pMVar1->force_flag = (byte)pMVar1->force_flag | 0x10;
      pMVar1->force_ref_mode = REF_TO_LT_REF_IDX;
      pMVar1->force_ref_arg = local_50;
    }
    if (-1 < local_54) {
      *(byte *)&pMVar1->force_flag = (byte)pMVar1->force_flag | 8;
      pMVar1->force_temporal_id = local_54;
    }
    uVar3 = 1;
    RVar2 = local_48;
    if (local_48 < 0) {
      uVar3 = (local_40->force).force_flag & 0xfffffffe;
      RVar2 = -1;
    }
    (local_40->force).force_flag = uVar3;
    (local_40->force).force_qp = RVar2;
    if (-1 < local_4c) {
      *(RK_S32 *)(*(long *)((long)local_38 + 8) + 0x3d0) = local_4c;
    }
  }
  if (((byte)h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","leave\n","h264e_start");
  }
  return MPP_OK;
}

Assistant:

static MPP_RET h264e_start(void *ctx, HalEncTask *task)
{
    h264e_dbg_func("enter\n");

    if (mpp_frame_has_meta(task->frame)) {
        MppEncRefFrmUsrCfg *frm_cfg = task->frm_cfg;
        EncRcForceCfg *rc_force = &task->rc_task->force;
        MppMeta meta = mpp_frame_get_meta(task->frame);
        RK_S32 force_lt_idx = -1;
        RK_S32 force_use_lt_idx = -1;
        RK_S32 force_frame_qp = -1;
        RK_S32 base_layer_pid = -1;
        RK_S32 force_tid = -1;

        mpp_meta_get_s32(meta, KEY_ENC_MARK_LTR, &force_lt_idx);
        mpp_meta_get_s32(meta, KEY_ENC_USE_LTR, &force_use_lt_idx);
        mpp_meta_get_s32(meta, KEY_ENC_FRAME_QP, &force_frame_qp);
        mpp_meta_get_s32(meta, KEY_ENC_BASE_LAYER_PID, &base_layer_pid);
        mpp_meta_get_s32(meta, KEY_TEMPORAL_ID, &force_tid);

        if (force_lt_idx >= 0) {
            frm_cfg->force_flag |= ENC_FORCE_LT_REF_IDX;
            frm_cfg->force_lt_idx = force_lt_idx;
        }

        if (force_use_lt_idx >= 0) {
            frm_cfg->force_flag |= ENC_FORCE_REF_MODE;
            frm_cfg->force_ref_mode = REF_TO_LT_REF_IDX;
            frm_cfg->force_ref_arg = force_use_lt_idx;
        }

        if (force_tid >= 0) {
            frm_cfg->force_flag |= ENC_FORCE_TEMPORAL_ID;
            frm_cfg->force_temporal_id = force_tid;
        }

        if (force_frame_qp >= 0) {
            rc_force->force_flag = ENC_RC_FORCE_QP;
            rc_force->force_qp = force_frame_qp;
        } else {
            rc_force->force_flag &= (~ENC_RC_FORCE_QP);
            rc_force->force_qp = -1;
        }

        if (base_layer_pid >= 0) {
            H264eCtx *p = (H264eCtx *)ctx;
            MppEncH264Cfg *h264 = &p->cfg->codec.h264;

            h264->base_layer_pid = base_layer_pid;
        }
    }

    h264e_dbg_func("leave\n");

    return MPP_OK;
}